

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void mbedtls_aes_encrypt(mbedtls_aes_context *ctx,uchar *input,uchar *output)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint *puVar24;
  uint32_t Y3;
  uint32_t Y2;
  uint32_t Y1;
  uint32_t Y0;
  uint32_t X3;
  uint32_t X2;
  uint32_t X1;
  uint32_t X0;
  uint32_t *RK;
  int i;
  uchar *output_local;
  uchar *input_local;
  mbedtls_aes_context *ctx_local;
  
  puVar24 = ctx->rk;
  X2 = *puVar24 ^ *(uint *)input;
  X3 = puVar24[1] ^ *(uint *)(input + 4);
  Y0 = puVar24[2] ^ *(uint *)(input + 8);
  _X1 = puVar24 + 4;
  Y1 = puVar24[3] ^ *(uint *)(input + 0xc);
  RK._4_4_ = ctx->nr >> 1;
  while (RK._4_4_ = RK._4_4_ + -1, 0 < RK._4_4_) {
    uVar16 = *_X1 ^ FT0[X2 & 0xff] ^ FT1[X3 >> 8 & 0xff] ^ FT2[Y0 >> 0x10 & 0xff] ^ FT3[Y1 >> 0x18];
    uVar17 = _X1[1] ^ FT0[X3 & 0xff] ^ FT1[Y0 >> 8 & 0xff] ^ FT2[Y1 >> 0x10 & 0xff] ^
             FT3[X2 >> 0x18];
    uVar18 = _X1[2] ^ FT0[Y0 & 0xff] ^ FT1[Y1 >> 8 & 0xff] ^ FT2[X2 >> 0x10 & 0xff] ^
             FT3[X3 >> 0x18];
    uVar19 = _X1[3] ^ FT0[Y1 & 0xff] ^ FT1[X2 >> 8 & 0xff] ^ FT2[X3 >> 0x10 & 0xff] ^
             FT3[Y0 >> 0x18];
    X2 = _X1[4] ^ FT0[uVar16 & 0xff] ^ FT1[uVar17 >> 8 & 0xff] ^ FT2[uVar18 >> 0x10 & 0xff] ^
         FT3[uVar19 >> 0x18];
    X3 = _X1[5] ^ FT0[uVar17 & 0xff] ^ FT1[uVar18 >> 8 & 0xff] ^ FT2[uVar19 >> 0x10 & 0xff] ^
         FT3[uVar16 >> 0x18];
    puVar24 = _X1 + 7;
    Y0 = _X1[6] ^ FT0[uVar18 & 0xff] ^ FT1[uVar19 >> 8 & 0xff] ^ FT2[uVar16 >> 0x10 & 0xff] ^
         FT3[uVar17 >> 0x18];
    _X1 = _X1 + 8;
    Y1 = *puVar24 ^ FT0[uVar19 & 0xff] ^ FT1[uVar16 >> 8 & 0xff] ^ FT2[uVar17 >> 0x10 & 0xff] ^
         FT3[uVar18 >> 0x18];
  }
  uVar20 = *_X1 ^ FT0[X2 & 0xff] ^ FT1[X3 >> 8 & 0xff] ^ FT2[Y0 >> 0x10 & 0xff] ^ FT3[Y1 >> 0x18];
  uVar21 = _X1[1] ^ FT0[X3 & 0xff] ^ FT1[Y0 >> 8 & 0xff] ^ FT2[Y1 >> 0x10 & 0xff] ^ FT3[X2 >> 0x18];
  uVar22 = _X1[2] ^ FT0[Y0 & 0xff] ^ FT1[Y1 >> 8 & 0xff] ^ FT2[X2 >> 0x10 & 0xff] ^ FT3[X3 >> 0x18];
  uVar23 = _X1[3] ^ FT0[Y1 & 0xff] ^ FT1[X2 >> 8 & 0xff] ^ FT2[X3 >> 0x10 & 0xff] ^ FT3[Y0 >> 0x18];
  uVar16 = _X1[4];
  bVar1 = FSb[uVar21 >> 8 & 0xff];
  bVar2 = FSb[uVar22 >> 0x10 & 0xff];
  bVar3 = FSb[uVar23 >> 0x18];
  uVar17 = _X1[5];
  bVar4 = FSb[uVar21 & 0xff];
  bVar5 = FSb[uVar22 >> 8 & 0xff];
  bVar6 = FSb[uVar23 >> 0x10 & 0xff];
  bVar7 = FSb[uVar20 >> 0x18];
  uVar18 = _X1[6];
  bVar8 = FSb[uVar22 & 0xff];
  bVar9 = FSb[uVar23 >> 8 & 0xff];
  bVar10 = FSb[uVar20 >> 0x10 & 0xff];
  bVar11 = FSb[uVar21 >> 0x18];
  uVar19 = _X1[7];
  bVar12 = FSb[uVar23 & 0xff];
  bVar13 = FSb[uVar20 >> 8 & 0xff];
  bVar14 = FSb[uVar21 >> 0x10 & 0xff];
  bVar15 = FSb[uVar22 >> 0x18];
  *output = (byte)uVar16 ^ FSb[uVar20 & 0xff];
  output[1] = (byte)(uVar16 >> 8) ^ bVar1;
  output[2] = (byte)(uVar16 >> 0x10) ^ bVar2;
  output[3] = (byte)(uVar16 >> 0x18) ^ bVar3;
  output[4] = (byte)uVar17 ^ bVar4;
  output[5] = (byte)(uVar17 >> 8) ^ bVar5;
  output[6] = (byte)(uVar17 >> 0x10) ^ bVar6;
  output[7] = (byte)(uVar17 >> 0x18) ^ bVar7;
  output[8] = (byte)uVar18 ^ bVar8;
  output[9] = (byte)(uVar18 >> 8) ^ bVar9;
  output[10] = (byte)(uVar18 >> 0x10) ^ bVar10;
  output[0xb] = (byte)(uVar18 >> 0x18) ^ bVar11;
  output[0xc] = (byte)uVar19 ^ bVar12;
  output[0xd] = (byte)(uVar19 >> 8) ^ bVar13;
  output[0xe] = (byte)(uVar19 >> 0x10) ^ bVar14;
  output[0xf] = (byte)(uVar19 >> 0x18) ^ bVar15;
  return;
}

Assistant:

void mbedtls_aes_encrypt( mbedtls_aes_context *ctx,
                          const unsigned char input[16],
                          unsigned char output[16] )
{
    int i;
    uint32_t *RK, X0, X1, X2, X3, Y0, Y1, Y2, Y3;

    RK = ctx->rk;

    GET_UINT32_LE( X0, input,  0 ); X0 ^= *RK++;
    GET_UINT32_LE( X1, input,  4 ); X1 ^= *RK++;
    GET_UINT32_LE( X2, input,  8 ); X2 ^= *RK++;
    GET_UINT32_LE( X3, input, 12 ); X3 ^= *RK++;

    for( i = ( ctx->nr >> 1 ) - 1; i > 0; i-- )
    {
        AES_FROUND( Y0, Y1, Y2, Y3, X0, X1, X2, X3 );
        AES_FROUND( X0, X1, X2, X3, Y0, Y1, Y2, Y3 );
    }

    AES_FROUND( Y0, Y1, Y2, Y3, X0, X1, X2, X3 );

    X0 = *RK++ ^ \
            ( (uint32_t) FSb[ ( Y0       ) & 0xFF ]       ) ^
            ( (uint32_t) FSb[ ( Y1 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) FSb[ ( Y2 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) FSb[ ( Y3 >> 24 ) & 0xFF ] << 24 );

    X1 = *RK++ ^ \
            ( (uint32_t) FSb[ ( Y1       ) & 0xFF ]       ) ^
            ( (uint32_t) FSb[ ( Y2 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) FSb[ ( Y3 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) FSb[ ( Y0 >> 24 ) & 0xFF ] << 24 );

    X2 = *RK++ ^ \
            ( (uint32_t) FSb[ ( Y2       ) & 0xFF ]       ) ^
            ( (uint32_t) FSb[ ( Y3 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) FSb[ ( Y0 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) FSb[ ( Y1 >> 24 ) & 0xFF ] << 24 );

    X3 = *RK++ ^ \
            ( (uint32_t) FSb[ ( Y3       ) & 0xFF ]       ) ^
            ( (uint32_t) FSb[ ( Y0 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) FSb[ ( Y1 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) FSb[ ( Y2 >> 24 ) & 0xFF ] << 24 );

    PUT_UINT32_LE( X0, output,  0 );
    PUT_UINT32_LE( X1, output,  4 );
    PUT_UINT32_LE( X2, output,  8 );
    PUT_UINT32_LE( X3, output, 12 );
}